

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeResume
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType ct,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *tags,
          vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *labels
          )

{
  MixedArena **operands;
  bool bVar1;
  size_t size;
  Resume *expr;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *sentTypes;
  _Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *handlerBlocks;
  optional<wasm::HeapType> ct_00;
  undefined1 local_1b0 [8];
  Signature contSig;
  Resume curr;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  undefined1 local_c8 [8];
  Result<wasm::ResumeTable> resumetable;
  Result<wasm::ResumeTable> _val;
  _Storage<wasm::HeapType,_true> local_38;
  HeapType ct_local;
  
  local_38 = (_Storage<wasm::HeapType,_true>)ct.id;
  if ((long)(tags->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(tags->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
            super__Vector_impl_data._M_start >> 4 ==
      (long)(labels->
            super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(labels->
            super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 3) {
    bVar1 = HeapType::isContinuation(&local_38._M_value);
    if (bVar1) {
      curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements
           = (size_t)&this->wasm->allocator;
      operands = &curr.handlerBlocks.allocator;
      contSig.results.id._0_1_ = 0x5d;
      curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression._id = InvalidId;
      curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression._1_7_ = 0;
      curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression.type.id = 0;
      curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data = (Name *)0x0
      ;
      curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
      curr.handlerTags.allocator = (MixedArena *)0x0;
      curr.handlerBlocks.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data =
           (Name *)0x0;
      curr.handlerBlocks.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0
      ;
      curr.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      curr.handlerBlocks.allocator = (MixedArena *)0x0;
      curr.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
           = (Expression **)0x0;
      curr.cont = (Expression *)0x0;
      curr.sentTypes.super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.data = (Type *)0x0;
      curr.sentTypes.super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.usedElements = 0;
      curr.handlerBlocks.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
      allocatedElements =
           curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
           allocatedElements;
      curr.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements =
           curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
           allocatedElements;
      curr.sentTypes.super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.allocatedElements =
           curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
           allocatedElements;
      local_c8 = (undefined1  [8])HeapType::getContinuation(&local_38._M_value);
      _local_1b0 = HeapType::getSignature((HeapType *)local_c8);
      size = wasm::Type::size((Type *)local_1b0);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)operands,
                 size);
      local_e8._8_8_ = 0;
      local_d0 = std::
                 _Function_handler<wasm::Result<wasm::Type>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp:2433:5)>
                 ::_M_invoke;
      local_d8 = std::
                 _Function_handler<wasm::Result<wasm::Type>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp:2433:5)>
                 ::_M_manager;
      curr.sentTypes.allocator = (MixedArena *)this;
      local_e8._M_unused._M_object = this;
      makeResumeTable((Result<wasm::ResumeTable> *)local_c8,labels,
                      (function<wasm::Result<wasm::Name>_(unsigned_int)> *)&curr.sentTypes.allocator
                      ,(function<wasm::Result<wasm::Type>_(unsigned_int)> *)&local_e8);
      std::_Function_base::~_Function_base((_Function_base *)&local_e8);
      std::_Function_base::~_Function_base((_Function_base *)&curr.sentTypes.allocator);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *)
                      ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                              super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                              super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                              super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30),
                      (_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *)local_c8);
      if (_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
          super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
          super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
          super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
          super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
          super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
          _M_storage[0x28] == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                           super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30),
                   (string *)
                   ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                           super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                           super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                           super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
        std::__detail::__variant::_Variant_storage<false,_wasm::ResumeTable,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::ResumeTable,_wasm::Err> *)
                          ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                                  super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::ResumeTable,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::ResumeTable,_wasm::Err> *)
                          ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                                  super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
             (HeapType)(HeapType)local_38;
        _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
        super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
        super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
        super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
        super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
        super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_ = this;
        ChildPopper::visitResume
                  ((Result<wasm::Ok> *)
                   ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                           super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30),
                   (ChildPopper *)
                   ((long)&_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                           super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30),
                   (Resume *)&contSig.results,ct_00);
        if (_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
            super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
            super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
            super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
            super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
            super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
            _M_storage[0x18] == '\x01') {
          std::__cxx11::string::string
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                             super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30),
                     (string *)
                     ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                             super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
          _Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                     (__index_type *)
                     ((long)&_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                             super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                     ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                             super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
          anon_unknown_283::validateTypeAnnotation
                    ((Result<wasm::Ok> *)
                     ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                             super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30),
                     local_38._M_value.id,(Expression *)curr.operands.allocator);
          if (_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
              super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
              super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
              super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
              super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
              super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
              _M_storage[0x18] != '\x01') {
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                              ((long)&resumetable.val.
                                      super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                                      super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
            handlerBlocks = (_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *)0x0;
            if (resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
                _M_storage[0x28] == '\0') {
              handlerBlocks = (_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *)local_c8;
            }
            sentTypes = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)0x18;
            if (resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
                _M_storage[0x28] == '\0') {
              sentTypes = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                          ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                                  super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x10);
            }
            expr = Builder::makeResume(&this->builder,tags,
                                       (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                                       handlerBlocks,sentTypes,(ExpressionList *)operands,
                                       (Expression *)curr.operands.allocator);
            push(this,(Expression *)expr);
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
            goto LAB_00ce2158;
          }
          std::__cxx11::string::string
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                             super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30),
                     (string *)
                     ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                             super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
          _Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                     (__index_type *)
                     ((long)&_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                             super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
        }
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                           super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                           super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
      }
LAB_00ce2158:
      std::__detail::__variant::_Variant_storage<false,_wasm::ResumeTable,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::ResumeTable,_wasm::Err> *)local_c8);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&contSig.results,"expected continuation type",(allocator<char> *)local_c8);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&contSig.results
              );
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&contSig.results,"the sizes of tags and labels must be equal",
               (allocator<char> *)local_c8);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&contSig.results
              );
  }
  std::__cxx11::string::~string((string *)&contSig.results);
  return __return_storage_ptr__;
}

Assistant:

Result<>
IRBuilder::makeResume(HeapType ct,
                      const std::vector<Name>& tags,
                      const std::vector<std::optional<Index>>& labels) {
  if (tags.size() != labels.size()) {
    return Err{"the sizes of tags and labels must be equal"};
  }
  if (!ct.isContinuation()) {
    return Err{"expected continuation type"};
  }

  Resume curr(wasm.allocator);
  auto contSig = ct.getContinuation().type.getSignature();
  curr.operands.resize(contSig.params.size());

  Result<ResumeTable> resumetable = makeResumeTable(
    labels,
    [this](Index i) { return this->getLabelName(i); },
    [this](Index i) { return this->getLabelType(i); });
  CHECK_ERR(resumetable);
  CHECK_ERR(ChildPopper{*this}.visitResume(&curr, ct));
  CHECK_ERR(validateTypeAnnotation(ct, curr.cont));

  push(builder.makeResume(tags,
                          resumetable->targets,
                          resumetable->sentTypes,
                          std::move(curr.operands),
                          curr.cont));

  return Ok{};
}